

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeUnreachable(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Expression *pEVar2;
  BasicType local_1c;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_1c = unreachable;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&local_1c);
  if (!bVar1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x111b,"Expression *wasm::TranslateToFuzzReader::makeUnreachable(Type)");
  }
  pEVar2 = (Expression *)Builder::makeUnreachable(&this->builder);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeUnreachable(Type type) {
  assert(type == Type::unreachable);
  return builder.makeUnreachable();
}